

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int big_block_flush(BigBlock *block)

{
  BigAttr *pBVar1;
  BigAttr *pBVar2;
  uint uVar3;
  BigAttrSet *pBVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  FILE *pFVar8;
  undefined1 *__ptr;
  size_t sVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  char ndtype [8];
  char *local_f0;
  byte local_b8 [136];
  
  if (block->dirty != 0) {
    pFVar8 = (FILE *)_big_file_open_a_file(block->basename,-1,"w+",1);
    if (pFVar8 == (FILE *)0x0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x250);
      return -1;
    }
    iVar6 = fprintf(pFVar8,"DTYPE: %s\n",block);
    if (((iVar6 < 0) || (iVar6 = fprintf(pFVar8,"NMEMB: %d\n",(ulong)(uint)block->nmemb), iVar6 < 0)
        ) || (iVar6 = fprintf(pFVar8,"NFILE: %d\n",(ulong)(uint)block->Nfile), iVar6 < 0)) {
      pcVar14 = "Writing file header";
      iVar6 = 0x256;
LAB_0010461e:
      _big_file_raise(pcVar14,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,iVar6);
      fclose(pFVar8);
      return -1;
    }
    if (0 < block->Nfile) {
      uVar16 = 0;
      do {
        uVar3 = block->fchecksum[uVar16];
        uVar15 = (uVar3 >> 0x10) + (uVar3 & 0xffff);
        iVar6 = fprintf(pFVar8,"%06X: %td : %u : %u\n",uVar16 & 0xffffffff,block->fsize[uVar16],
                        (ulong)uVar3,(ulong)((uVar15 >> 0x10) + (uVar15 & 0xffff)));
        if (iVar6 < 0) {
          pcVar14 = "Writing file information to header";
          iVar6 = 0x25c;
          goto LAB_0010461e;
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)block->Nfile);
    }
    fclose(pFVar8);
    block->dirty = 0;
  }
  pBVar4 = block->attrset;
  if (pBVar4->dirty == 0) {
    return 0;
  }
  pcVar14 = block->basename;
  pBVar4->dirty = 0;
  pFVar8 = (FILE *)_big_file_open_a_file(pcVar14,-3,"w",1);
  if (pFVar8 == (FILE *)0x0) {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x621);
LAB_00104681:
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x264);
    return -1;
  }
  if (pBVar4->listused != 0) {
    uVar16 = 0;
    do {
      pBVar1 = pBVar4->attrlist + uVar16;
      pBVar2 = pBVar4->attrlist + uVar16;
      pcVar14 = pBVar2->dtype;
      _dtype_normalize((char *)local_b8,pcVar14);
      iVar6 = atoi((char *)(local_b8 + 2));
      uVar12 = (long)pBVar2->nmemb * (long)iVar6;
      __ptr = (undefined1 *)malloc(uVar12 * 2 + 1);
      pbVar5 = (byte *)pBVar2->data;
      if ((int)uVar12 < 1) {
        *__ptr = 0;
LAB_00104495:
        local_f0 = (char *)malloc((long)pBVar1->nmemb * 0x20 + 1);
        *local_f0 = '\0';
        if (0 < pBVar1->nmemb) {
          lVar13 = 0;
          uVar12 = 0;
          do {
            if (pBVar1->dtype[1] == 'a') {
LAB_001044ea:
              local_b8[0] = pbVar5[uVar12];
              local_b8[1] = 0;
              if (local_b8[0] == 0) break;
              if (local_b8[0] == 10) {
                sVar9 = strlen(local_f0);
                builtin_strncpy(local_f0 + sVar9,"...",4);
                break;
              }
              strcat(local_f0,(char *)local_b8);
            }
            else {
              if (pBVar1->dtype[1] == 'S') {
                _dtype_normalize((char *)local_b8,pcVar14);
                iVar7 = atoi((char *)(local_b8 + 2));
                if (iVar7 == 1) goto LAB_001044ea;
              }
              big_file_dtype_format((char *)local_b8,pcVar14,pbVar5 + lVar13,(char *)0x0);
              strcat(local_f0,(char *)local_b8);
              if (uVar12 != pBVar1->nmemb - 1) {
                sVar9 = strlen(local_f0);
                (local_f0 + sVar9)[0] = ' ';
                (local_f0 + sVar9)[1] = '\0';
              }
            }
            uVar12 = uVar12 + 1;
            lVar13 = lVar13 + iVar6;
          } while ((long)uVar12 < (long)pBVar1->nmemb);
        }
      }
      else {
        uVar10 = 0;
        pbVar11 = pbVar5;
        do {
          __ptr[uVar10] = "0123456789ABCDEF"[*pbVar11 >> 4];
          __ptr[uVar10 + 1] = "0123456789ABCDEF"[*pbVar11 & 0xf];
          uVar10 = uVar10 + 2;
          pbVar11 = pbVar11 + 1;
        } while ((uVar12 & 0xffffffff) * 2 != uVar10);
        __ptr[uVar10 & 0xffffffff] = 0;
        if ((int)uVar12 < 0x81) goto LAB_00104495;
        local_f0 = (char *)malloc(0x10);
        builtin_strncpy(local_f0,"... (Too Long) ",0x10);
      }
      iVar6 = fprintf(pFVar8,"%s %s %d %s #HUMANE [ %s ]\n",pBVar1->name,pcVar14,
                      (ulong)(uint)pBVar1->nmemb,__ptr,local_f0);
      free(__ptr);
      free(local_f0);
      if (iVar6 < 1) {
        _big_file_raise("Failed to write to file",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x656);
        fclose(pFVar8);
        goto LAB_00104681;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < pBVar4->listused);
  }
  fclose(pFVar8);
  block->attrset->dirty = 0;
  return 0;
}

Assistant:

int
big_block_flush(BigBlock * block)
{
    FILE * fheader = NULL;
    if(block->dirty) {
        int i;
        fheader = _big_file_open_a_file(block->basename, FILEID_HEADER, "w+", 1);
        RAISEIF(fheader == NULL, ex_fileio, NULL);
        RAISEIF(
            (0 > fprintf(fheader, "DTYPE: %s\n", block->dtype)) ||
            (0 > fprintf(fheader, "NMEMB: %d\n", block->nmemb)) ||
            (0 > fprintf(fheader, "NFILE: %d\n", block->Nfile)),
                ex_fprintf,
                "Writing file header");
        for(i = 0; i < block->Nfile; i ++) {
            unsigned int s = block->fchecksum[i];
            unsigned int r = (s & 0xffff) + ((s & 0xffffffff) >> 16);
            unsigned int checksum = (r & 0xffff) + (r >> 16);
            RAISEIF(0 > fprintf(fheader, EXT_DATA ": %td : %u : %u\n", i, block->fsize[i], block->fchecksum[i], checksum),
                ex_fprintf, "Writing file information to header");
        }
        fclose(fheader);
        block->dirty = 0;
    }
    if(block->attrset->dirty) {
        RAISEIF(0 != attrset_write_attr_set_v2(block->attrset, block->basename),
            ex_write_attr,
            NULL);
        block->attrset->dirty = 0;
    }
    return 0;

ex_fprintf:
    fclose(fheader);
ex_write_attr:
ex_fileio:
    return -1;
}